

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O0

_Bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  _Bool _Var1;
  long in_RSI;
  long in_RDI;
  ggml_cgraph *in_stack_000003a8;
  ggml_backend_sched_t in_stack_000003b0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (*(int *)(in_RSI + 4) + *(int *)(in_RSI + 8) <= (int)*(undefined8 *)(in_RDI + 0x110)) {
    ggml_backend_sched_split_graph(in_stack_000003b0,in_stack_000003a8);
    _Var1 = ggml_backend_sched_alloc_splits
                      ((ggml_backend_sched_t)
                       CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (_Var1) {
      *(undefined1 *)(in_RDI + 1) = 1;
    }
    return _Var1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
             ,0x617,"GGML_ASSERT(%s) failed",
             "(int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs");
}

Assistant:

bool ggml_backend_sched_alloc_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    GGML_ASSERT((int)sched->hash_set.size >= graph->n_nodes + graph->n_leafs);

    ggml_backend_sched_split_graph(sched, graph);


    if (!ggml_backend_sched_alloc_splits(sched)) {
        return false;
    }

    sched->is_alloc = true;

    return true;
}